

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

Gia_Man_t * Acb_NtkToGia2(Acb_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Vec_Int_t *vTemp;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar4;
  int local_34;
  int iObj;
  int i;
  Vec_Int_t *vNodes;
  Vec_Int_t *vFanins;
  Gia_Man_t *pOne;
  Gia_Man_t *pNew;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_NtkObjNum(p);
  p_00 = Gia_ManStart(iVar1 * 2 + 1000);
  pcVar3 = Acb_NtkName(p);
  pcVar3 = Abc_UtilStrsav(pcVar3);
  p_00->pName = pcVar3;
  Acb_NtkCleanObjCopies(p);
  for (local_34 = 0; iVar1 = Acb_NtkCiNum(p), local_34 < iVar1; local_34 = local_34 + 1) {
    iVar1 = Acb_NtkCi(p,local_34);
    iVar2 = Gia_ManAppendCi(p_00);
    Acb_ObjSetCopy(p,iVar1,iVar2);
  }
  vTemp = Vec_IntAlloc(4);
  p_01 = Acb_NtkFindNodes2(p);
  for (local_34 = 0; iVar1 = Vec_IntSize(p_01), local_34 < iVar1; local_34 = local_34 + 1) {
    iVar1 = Vec_IntEntry(p_01,local_34);
    iVar2 = Acb_ObjToGia2(p_00,p,iVar1,vTemp);
    Acb_ObjSetCopy(p,iVar1,iVar2);
  }
  Vec_IntFree(p_01);
  Vec_IntFree(vTemp);
  for (local_34 = 0; iVar1 = Acb_NtkCoNum(p), local_34 < iVar1; local_34 = local_34 + 1) {
    iVar1 = Acb_NtkCo(p,local_34);
    iVar1 = Acb_ObjFanin(p,iVar1,0);
    iVar1 = Acb_ObjCopy(p,iVar1);
    Gia_ManAppendCo(p_00,iVar1);
  }
  pGVar4 = Gia_ManCleanup(p_00);
  Gia_ManUpdateCopy(&p->vObjCopy,p_00);
  Gia_ManStop(p_00);
  return pGVar4;
}

Assistant:

Gia_Man_t * Acb_NtkToGia2( Acb_Ntk_t * p )
{
    Gia_Man_t * pNew, * pOne;
    Vec_Int_t * vFanins, * vNodes;
    int i, iObj;
    pNew = Gia_ManStart( 2 * Acb_NtkObjNum(p) + 1000 );
    pNew->pName = Abc_UtilStrsav(Acb_NtkName(p));
    Acb_NtkCleanObjCopies( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    vFanins = Vec_IntAlloc( 4 );
    vNodes  = Acb_NtkFindNodes2( p );
    Vec_IntForEachEntry( vNodes, iObj, i )
        Acb_ObjSetCopy( p, iObj, Acb_ObjToGia2(pNew, p, iObj, vFanins) );
    Vec_IntFree( vNodes );
    Vec_IntFree( vFanins );
    Acb_NtkForEachCo( p, iObj, i )
        Gia_ManAppendCo( pNew, Acb_ObjCopy(p, Acb_ObjFanin(p, iObj, 0)) );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManUpdateCopy( &p->vObjCopy, pOne );
    Gia_ManStop( pOne );
    return pNew;
}